

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::(anonymous_namespace)::
FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
          (_anonymous_namespace_ *this,Decomposed<double> decomposed,size_t precision,Buffer *out,
          int *exp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  size_t sVar4;
  _anonymous_namespace_ *this_00;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  size_t extra_digits;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  uVar14 = decomposed._8_8_;
  if (0x27 < uVar14) {
    return false;
  }
  uVar11 = (uint)decomposed.mantissa;
  *(size_t *)(precision + 0x60) = precision + 0x29;
  *(size_t *)(precision + 0x58) = precision + 0x29;
  if (-1 < (int)uVar11) {
    if (uVar11 < 0xc) {
      sVar4 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                        ((long)this << ((byte)decomposed.mantissa & 0x3f),(Buffer *)precision);
      uVar10 = sVar4 - 1;
      *(int *)out->data = (int)uVar10;
      extra_digits = uVar10 - uVar14;
      if (uVar10 < uVar14 || extra_digits == 0) {
        for (lVar13 = ~uVar14 + sVar4; lVar13 != 0; lVar13 = lVar13 + 1) {
          anon_unknown_0::Buffer::push_back((Buffer *)precision,'0');
        }
        return true;
      }
    }
    else {
      if (0x4b < uVar11) {
        return false;
      }
      auVar16 = __ashlti3(this,0,uVar11 & 0xff);
      auVar17._8_8_ = in_stack_ffffffffffffffc0;
      auVar17._0_8_ = in_stack_ffffffffffffffb8;
      sVar4 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                        (auVar16._0_8_,(unsigned___int128)auVar17,auVar16._8_8_);
      uVar10 = sVar4 - 1;
      *(int *)out->data = (int)uVar10;
      extra_digits = uVar10 - uVar14;
      if (uVar10 < uVar14 || extra_digits == 0) {
        for (lVar13 = ~uVar14 + sVar4; lVar13 != 0; lVar13 = lVar13 + 1) {
          anon_unknown_0::Buffer::push_back((Buffer *)precision,'0');
        }
        return true;
      }
    }
    bVar15 = false;
LAB_002e7bbd:
    anon_unknown_0::RemoveExtraPrecision(extra_digits,bVar15,(Buffer *)precision,(int *)out);
    return true;
  }
  if (uVar11 < 0xffffffc4) {
    if (uVar11 < 0xffffff84) {
      return false;
    }
    uVar11 = -uVar11;
    auVar17 = __ashlti3();
    uVar8 = ~auVar17._8_8_;
    uVar9 = ~auVar17._0_8_;
    uVar12 = 0;
    this_00 = (_anonymous_namespace_ *)__lshrti3(this,0,uVar11 & 0xff);
    auVar16._8_8_ = uVar8;
    auVar16._0_8_ = out;
    sVar4 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                      (this_00,(unsigned___int128)auVar16,(Buffer *)0x0);
    uVar10 = (ulong)this & uVar9;
    if (sVar4 == 0) {
      out->data[0] = '\0';
      out->data[1] = '\0';
      out->data[2] = '\0';
      out->data[3] = '\0';
      iVar7 = 0;
      if (uVar10 == 0) {
        uVar10 = 0;
        uVar12 = 0;
      }
      else {
        for (; uVar12 <= uVar8 && (ulong)(uVar9 < uVar10) <= uVar8 - uVar12;
            uVar12 = uVar12 * 10 + SUB168(auVar1 * ZEXT816(10),8)) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar10;
          uVar10 = SUB168(auVar1 * ZEXT816(10),0);
          iVar7 = iVar7 + -1;
        }
        *(int *)out->data = iVar7;
      }
      cVar3 = __lshrti3(uVar10,uVar12,uVar11 & 0xff);
      anon_unknown_0::Buffer::push_front((Buffer *)precision,cVar3 + '0');
      anon_unknown_0::Buffer::push_back((Buffer *)precision,'.');
      uVar10 = uVar10 & uVar9;
      uVar12 = uVar12 & uVar8;
    }
    else {
      uVar5 = sVar4 - 1;
      *(int *)out->data = (int)uVar5;
      extra_digits = uVar5 - uVar14;
      if (uVar14 <= uVar5 && extra_digits != 0) {
        bVar15 = uVar10 != 0;
        goto LAB_002e7bbd;
      }
      uVar14 = uVar14 - uVar5;
    }
    while( true ) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar10;
      uVar10 = SUB168(auVar2 * ZEXT816(10),0);
      uVar12 = uVar12 * 10 + SUB168(auVar2 * ZEXT816(10),8);
      cVar3 = __lshrti3(uVar10,uVar12,uVar11 & 0xff);
      uVar10 = uVar10 & uVar9;
      uVar12 = uVar12 & uVar8;
      bVar15 = uVar14 == 0;
      uVar14 = uVar14 - 1;
      if (bVar15) break;
      anon_unknown_0::Buffer::push_back((Buffer *)precision,cVar3 + '0');
    }
    if ('\x05' < cVar3) goto LAB_002e7e35;
    if (cVar3 != '\x05') {
      return true;
    }
    if (uVar10 != 0 || uVar12 != 0) goto LAB_002e7e35;
    cVar3 = *(char *)(*(long *)(precision + 0x60) + -1);
    if (cVar3 == '.') {
      cVar3 = *(char *)(*(long *)(precision + 0x60) + -2);
    }
  }
  else {
    bVar6 = -(byte)decomposed.mantissa;
    uVar8 = ~(-1L << (bVar6 & 0x3f));
    sVar4 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                      ((ulong)this >> (bVar6 & 0x3f),(Buffer *)precision);
    uVar10 = (ulong)this & uVar8;
    if (sVar4 == 0) {
      out->data[0] = '\0';
      out->data[1] = '\0';
      out->data[2] = '\0';
      out->data[3] = '\0';
      iVar7 = 0;
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        for (; uVar10 <= uVar8; uVar10 = uVar10 * 10) {
          iVar7 = iVar7 + -1;
        }
        *(int *)out->data = iVar7;
      }
      anon_unknown_0::Buffer::push_front((Buffer *)precision,(char)(uVar10 >> (bVar6 & 0x3f)) + '0')
      ;
      anon_unknown_0::Buffer::push_back((Buffer *)precision,'.');
      uVar10 = uVar10 & uVar8;
    }
    else {
      uVar9 = sVar4 - 1;
      *(int *)out->data = (int)uVar9;
      extra_digits = uVar9 - uVar14;
      if (uVar14 <= uVar9 && extra_digits != 0) {
        bVar15 = uVar10 != 0;
        goto LAB_002e7bbd;
      }
      uVar14 = uVar14 - uVar9;
    }
    while( true ) {
      uVar9 = uVar10 * 10;
      uVar10 = uVar9 & uVar8;
      bVar15 = uVar14 == 0;
      uVar14 = uVar14 - 1;
      cVar3 = (char)(uVar9 >> (bVar6 & 0x3f));
      if (bVar15) break;
      anon_unknown_0::Buffer::push_back((Buffer *)precision,cVar3 + '0');
    }
    if ('\x05' < cVar3) goto LAB_002e7e35;
    if (cVar3 != '\x05') {
      return true;
    }
    if (uVar10 != 0) goto LAB_002e7e35;
    cVar3 = *(char *)(*(long *)(precision + 0x60) + -1);
    if (cVar3 == '.') {
      cVar3 = *(char *)(*(long *)(precision + 0x60) + -2);
    }
  }
  if (((int)cVar3 & 0x80000001U) != 1) {
    return true;
  }
LAB_002e7e35:
  anon_unknown_0::
  RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
            ((Buffer *)precision,(int *)out);
  return true;
}

Assistant:

bool FloatToBuffer(Decomposed<Float> decomposed,
                   size_t precision,
                   Buffer* out,
                   int* exp) {
  if (precision > kMaxFixedPrecision) return false;

  // Try with uint64_t.
  if (CanFitMantissa<Float, std::uint64_t>() &&
      FloatToBufferImpl<std::uint64_t, Float, mode>(
          static_cast<std::uint64_t>(decomposed.mantissa), decomposed.exponent,
          precision, out, exp))
    return true;

#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // If that is not enough, try with __uint128_t.
  return CanFitMantissa<Float, __uint128_t>() &&
         FloatToBufferImpl<__uint128_t, Float, mode>(
             static_cast<__uint128_t>(decomposed.mantissa), decomposed.exponent,
             precision, out, exp);
#endif
  return false;
}